

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VgaDebugGenerator.cpp
# Opt level: O0

void __thiscall
VgaDebugGenerator::Generate_Declaration(VgaDebugGenerator *this,Module *module,ofstream *fout)

{
  bool bVar1;
  ostream *poVar2;
  reference pWVar3;
  Wire *wire;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Wire,_std::allocator<Wire>_> *__range1;
  ofstream *fout_local;
  Module *module_local;
  VgaDebugGenerator *this_local;
  
  poVar2 = std::operator<<((ostream *)fout,"\n\n`define VGA_DBG_");
  poVar2 = std::operator<<(poVar2,(string *)module);
  std::operator<<(poVar2,"_Declaration");
  __end1 = std::vector<Wire,_std::allocator<Wire>_>::begin(&module->wires);
  wire = (Wire *)std::vector<Wire,_std::allocator<Wire>_>::end(&module->wires);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Wire_*,_std::vector<Wire,_std::allocator<Wire>_>_>
                                *)&wire);
    if (!bVar1) break;
    pWVar3 = __gnu_cxx::__normal_iterator<const_Wire_*,_std::vector<Wire,_std::allocator<Wire>_>_>::
             operator*(&__end1);
    std::operator<<((ostream *)fout," \\\n    wire ");
    if (1 < pWVar3->len_bits) {
      poVar2 = std::operator<<((ostream *)fout,"[");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pWVar3->len_bits + -1);
      std::operator<<(poVar2,":0] ");
    }
    poVar2 = std::operator<<((ostream *)fout,"dbg_");
    poVar2 = std::operator<<(poVar2,(string *)&pWVar3->full_name);
    std::operator<<(poVar2,";");
    __gnu_cxx::__normal_iterator<const_Wire_*,_std::vector<Wire,_std::allocator<Wire>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void VgaDebugGenerator::Generate_Declaration(const Module &module, std::ofstream &fout) {
    fout << "\n\n`define VGA_DBG_" << module.name << "_Declaration";
    for (const auto &wire : module.wires) {
        fout << " \\\n    wire ";
        if (wire.len_bits > 1) {
            fout << "[" << wire.len_bits - 1 << ":0] ";
        }
        fout << "dbg_" << wire.full_name << ";";
    }
}